

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O0

DispatchCallResult __thiscall
capnproto_test::capnp::test::TestMembrane::Thing::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  CallContext<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,_capnproto_test::capnp::test::TestMembrane::Result>
  CVar1;
  CallContext<capnproto_test::capnp::test::TestMembrane::Thing::InterceptParams,_capnproto_test::capnp::test::TestMembrane::Result>
  CVar2;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined6 in_register_00000032;
  long *plVar4;
  DispatchCallResult DVar5;
  uint16_t methodId_local;
  Server *this_local;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> context_local;
  undefined8 uVar3;
  
  plVar4 = (long *)CONCAT62(in_register_00000032,methodId);
  if ((short)context.hook == 0) {
    CVar1 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,capnproto_test::capnp::test::TestMembrane::Result>
                      ((Server *)((long)plVar4 + *(long *)(*plVar4 + -0x18)),in_RCX);
    (**(code **)(*plVar4 + 8))(this,plVar4,CVar1.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar3 = extraout_RDX;
  }
  else if ((short)context.hook == 1) {
    CVar2 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestMembrane::Thing::InterceptParams,capnproto_test::capnp::test::TestMembrane::Result>
                      ((Server *)((long)plVar4 + *(long *)(*plVar4 + -0x18)),in_RCX);
    (**(code **)(*plVar4 + 0x10))(this,plVar4,CVar2.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar3 = extraout_RDX_00;
  }
  else {
    DVar5 = ::capnp::Capability::Server::internalUnimplemented
                      ((Server *)this,(char *)((long)plVar4 + *(long *)(*plVar4 + -0x18)),0x491e75,
                       0x3917);
    uVar3 = DVar5._8_8_;
  }
  DVar5.isStreaming = (bool)(char)uVar3;
  DVar5.allowCancellation = (bool)(char)((ulong)uVar3 >> 8);
  DVar5._10_6_ = (int6)((ulong)uVar3 >> 0x10);
  DVar5.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar5;
}

Assistant:

::capnp::Capability::Server::DispatchCallResult TestMembrane::Thing::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return {
        passThrough(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMembrane::Thing::PassThroughParams,  ::capnproto_test::capnp::test::TestMembrane::Result>(context)),
        false,
        false
      };
    case 1:
      return {
        intercept(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMembrane::Thing::InterceptParams,  ::capnproto_test::capnp::test::TestMembrane::Result>(context)),
        false,
        false
      };
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestMembrane.Thing",
          0x9352e4e41f173917ull, methodId);
  }
}